

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cpio.c
# Opt level: O1

int64_t atol16(char *p,uint char_cnt)

{
  byte bVar1;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  
  if (char_cnt == 0) {
    return 0;
  }
  lVar3 = 0;
  uVar2 = 0;
  do {
    bVar1 = p[lVar3];
    if ((byte)(bVar1 + 0x9f) < 6) {
      uVar4 = bVar1 - 0x57;
    }
    else if ((byte)(bVar1 + 0xbf) < 6) {
      uVar4 = bVar1 - 0x37;
    }
    else {
      if (9 < (byte)(bVar1 - 0x30)) {
        return uVar2;
      }
      uVar4 = (uint)(byte)(bVar1 - 0x30);
    }
    uVar2 = uVar2 << 4 | (ulong)uVar4;
    lVar3 = lVar3 + 1;
  } while (char_cnt != (uint)lVar3);
  return uVar2;
}

Assistant:

static int64_t
atol16(const char *p, unsigned char_cnt)
{
	int64_t l;
	int digit;

	l = 0;
	while (char_cnt-- > 0) {
		if (*p >= 'a' && *p <= 'f')
			digit = *p - 'a' + 10;
		else if (*p >= 'A' && *p <= 'F')
			digit = *p - 'A' + 10;
		else if (*p >= '0' && *p <= '9')
			digit = *p - '0';
		else
			return (l);
		p++;
		l <<= 4;
		l |= digit;
	}
	return (l);
}